

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O1

int has_html(SXML_CHAR *html)

{
  char cVar1;
  char *pcVar2;
  
  if ((html != (SXML_CHAR *)0x0) && (*html != '\0')) {
    pcVar2 = html + 1;
    do {
      if (pcVar2[-1] == '&') {
        return 1;
      }
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
  }
  return 0;
}

Assistant:

int has_html(SXML_CHAR* html)
{
	if (html == NULL || *html == NULC)
		return FALSE;

	do {
		if (*html++ == C2SX('&'))
			return TRUE;
	} while (*html);
	
	return FALSE;
}